

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVDB.h
# Opt level: O0

void __thiscall
nanovdb::ReadAccessor<float,0,1,2>::
insert<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>>
          (ReadAccessor<float,_0,_1,_2> *this,CoordType *ijk,
          InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U> *node)

{
  undefined4 in_EDX;
  undefined4 in_register_00000014;
  long in_RDI;
  Coord CVar1;
  IndexType in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  CVar1 = Coord::operator&((Coord *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffcc);
  *(long *)(in_RDI + 0xc) = CVar1.mVec._0_8_;
  *(int32_t *)(in_RDI + 0x14) = CVar1.mVec[2];
  *(ulong *)(in_RDI + 0x38) = CONCAT44(in_register_00000014,in_EDX);
  return;
}

Assistant:

__hostdev__ void insert(const CoordType& ijk, const NodeT* node) const
    {
#ifdef USE_SINGLE_ACCESSOR_KEY
        mKey = ijk;
#else
        mKeys[NodeT::LEVEL] = ijk & ~NodeT::MASK;
#endif
        mNode[NodeT::LEVEL] = node;
    }